

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::erase_check(base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
              *this,key_type *key)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  iterator iVar3;
  const_iterator cVar4;
  AssertHelper local_1d8;
  Message local_1d0;
  pair<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>_>
  local_1c8;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>_>
  local_1a8;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *local_168;
  int local_160;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_158;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *local_148;
  int local_140;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  local_138;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  Message local_c8;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *local_c0;
  int local_b8;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  local_b0;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *local_a0;
  int local_98;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_90;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  AssertHelper local_50 [3];
  Message local_38;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  key_type *key_local;
  base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
  *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )key;
  bVar1 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
          ::contains<std::pair<int,int>>
                    ((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
                      *)this,key);
  local_29 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_28,(AssertionResult *)0x4f4a4b,"true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  iVar3 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
          ::find<std::pair<int,int>>
                    ((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
                      *)this,(key_arg<std::pair<int,_int>_> *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  local_a0 = iVar3.node;
  local_98 = iVar3.position;
  local_90.node = local_a0;
  local_90.position = local_98;
  cVar4 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
          ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
                 *)this->const_tree_);
  local_c0 = cVar4.node;
  local_b8 = cVar4.position;
  local_b0.node = local_c0;
  local_b0.position = local_b8;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_nullptr>
            ((EqHelper *)local_80,"tree_.find(key)","const_tree_.end()",&local_90,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  bVar1 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
          ::contains<std::pair<int,int>>
                    ((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
                      *)this->const_tree_,
                     (key_arg<std::pair<int,_int>_> *)
                     gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  local_e1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_e0,
               (AssertionResult *)"const_tree_.contains(key)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  cVar4 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
          ::find<std::pair<int,int>>
                    ((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
                      *)this->const_tree_,
                     (key_arg<std::pair<int,_int>_> *)
                     gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  local_148 = cVar4.node;
  local_140 = cVar4.position;
  local_138.node = local_148;
  local_138.position = local_140;
  iVar3 = btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
          ::end((btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
                 *)this);
  local_168 = iVar3.node;
  local_160 = iVar3.position;
  local_158.node = local_168;
  local_158.position = local_160;
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_nullptr>
            ((EqHelper *)local_128,"const_tree_.find(key)","tree_.end()",&local_138,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
  ::equal_range<std::pair<int,int>>
            (&local_1a8,
             (btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
              *)this,(key_arg<std::pair<int,_int>_> *)
                     gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
  ::equal_range<std::pair<int,int>>
            (&local_1c8,
             (btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>>
              *)this->const_tree_,
             (key_arg<std::pair<int,_int>_> *)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::EqHelper::
  Compare<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_nullptr>
            ((EqHelper *)local_188,"tree_.equal_range(key).first",
             "const_tree_.equal_range(key).second",&local_1a8.first,&local_1c8.second);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  return;
}

Assistant:

void erase_check(const key_type &key) {
        EXPECT_FALSE(tree_.contains(key));
        EXPECT_EQ(tree_.find(key), const_tree_.end());
        EXPECT_FALSE(const_tree_.contains(key));
        EXPECT_EQ(const_tree_.find(key), tree_.end());
        EXPECT_EQ(tree_.equal_range(key).first,
                  const_tree_.equal_range(key).second);
    }